

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int jx9Builtin_printf(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  int iVar1;
  int local_3c;
  char *pcStack_38;
  int nLen;
  char *zFormat;
  jx9_int64 nCounter;
  jx9_value **apArg_local;
  jx9_context *pjStack_18;
  int nArg_local;
  jx9_context *pCtx_local;
  
  zFormat = (char *)0x0;
  nCounter = (jx9_int64)apArg;
  apArg_local._4_4_ = nArg;
  pjStack_18 = pCtx;
  if ((0 < nArg) && (iVar1 = jx9_value_is_string(*apArg), iVar1 != 0)) {
    pcStack_38 = jx9_value_to_string(*(jx9_value **)nCounter,&local_3c);
    if (local_3c < 1) {
      jx9_result_int(pjStack_18,0);
      return 0;
    }
    jx9InputFormat(printfConsumer,pjStack_18,pcStack_38,local_3c,apArg_local._4_4_,
                   (jx9_value **)nCounter,&zFormat,0);
    jx9_result_int64(pjStack_18,(jx9_int64)zFormat);
    return 0;
  }
  jx9_result_int(pjStack_18,0);
  return 0;
}

Assistant:

static int jx9Builtin_printf(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	jx9_int64 nCounter = 0;
	const char *zFormat;
	int nLen;
	if( nArg < 1 || !jx9_value_is_string(apArg[0]) ){
		/* Missing/Invalid arguments, return 0 */
		jx9_result_int(pCtx, 0);
		return JX9_OK;
	}
	/* Extract the string format */
	zFormat = jx9_value_to_string(apArg[0], &nLen);
	if( nLen < 1 ){
		/* Empty string */
		jx9_result_int(pCtx, 0);
		return JX9_OK;
	}
	/* Format the string */
	jx9InputFormat(printfConsumer, pCtx, zFormat, nLen, nArg, apArg, (void *)&nCounter, FALSE);
	/* Return the length of the outputted string */
	jx9_result_int64(pCtx, nCounter);
	return JX9_OK;
}